

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSkeletonAnimationKeyFrame
          (OgreBinarySerializer *this,VertexAnimationTrack *dest)

{
  TransformKeyFrame keyframe;
  TransformKeyFrame local_44;
  
  TransformKeyFrame::TransformKeyFrame(&local_44);
  local_44.timePos = Read<float>(this);
  ReadQuaternion(this,&local_44.rotation);
  ReadVector(this,&local_44.position);
  if (0x26 < this->m_currentLen) {
    ReadVector(this,&local_44.scale);
  }
  std::vector<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>::
  push_back(&dest->transformKeyFrames,&local_44);
  return;
}

Assistant:

void OgreBinarySerializer::ReadSkeletonAnimationKeyFrame(VertexAnimationTrack *dest)
{
    TransformKeyFrame keyframe;
    keyframe.timePos = Read<float>();

    // Rot and pos
    ReadQuaternion(keyframe.rotation);
    ReadVector(keyframe.position);

    // Scale (optional)
    if (m_currentLen > MSTREAM_KEYFRAME_SIZE_WITHOUT_SCALE)
        ReadVector(keyframe.scale);

    dest->transformKeyFrames.push_back(keyframe);
}